

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DIS_Logger_Record.cpp
# Opt level: O0

void __thiscall
KDIS::UTILS::DIS_Logger_Record::DIS_Logger_Record
          (DIS_Logger_Record *this,KString *FileName,KBOOL WriteToFile)

{
  _Ios_Openmode _Var1;
  KBOOL WriteToFile_local;
  KString *FileName_local;
  DIS_Logger_Record *this_local;
  
  std::fstream::fstream(this);
  this->m_bWriteToFile = WriteToFile;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_vsLog);
  _Var1 = std::__cxx11::string::c_str();
  std::fstream::open((char *)this,_Var1);
  return;
}

Assistant:

DIS_Logger_Record::DIS_Logger_Record( const KString & FileName, KBOOL WriteToFile ) :
    m_bWriteToFile( WriteToFile )
{
    m_File.open( FileName.c_str(), ios::out );
}